

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O1

void __thiscall adios2::core::engine::ssc::SscWriterGeneric::EndStepFirst(SscWriterGeneric *this)

{
  SyncWritePattern(this,false);
  MPI_Win_create((this->super_SscWriterBase).m_Buffer.m_Buffer,
                 (this->super_SscWriterBase).m_Buffer.m_Size,1,&ompi_mpi_info_null,
                 (this->super_SscWriterBase).m_StreamComm,&this->m_MpiWin);
  MPI_Win_free(&this->m_MpiWin);
  SyncReadPattern(this);
  return;
}

Assistant:

void SscWriterGeneric::EndStepFirst()
{
    SyncWritePattern();
    MPI_Win_create(m_Buffer.data(), m_Buffer.size(), 1, MPI_INFO_NULL, m_StreamComm, &m_MpiWin);
    MPI_Win_free(&m_MpiWin);
    SyncReadPattern();
}